

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextAttribute(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (ctxt->context->node == (xmlNodePtr)0x0) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (ctxt->context->node->type == XML_ELEMENT_NODE) {
    if (cur == (xmlNodePtr)0x0) {
      if ((xmlDocPtr)ctxt->context->node == ctxt->context->doc) {
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->properties;
      }
    }
    else {
      ctxt_local = (xmlXPathParserContextPtr)cur->next;
    }
  }
  else {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
xmlXPathNextAttribute(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (ctxt->context->node == NULL)
	return(NULL);
    if (ctxt->context->node->type != XML_ELEMENT_NODE)
	return(NULL);
    if (cur == NULL) {
        if (ctxt->context->node == (xmlNodePtr) ctxt->context->doc)
	    return(NULL);
        return((xmlNodePtr)ctxt->context->node->properties);
    }
    return((xmlNodePtr)cur->next);
}